

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O2

void __thiscall rtosc::UndoHistory::showHistory(UndoHistory *this)

{
  UndoHistoryImpl *pUVar1;
  _Elt_pointer ppVar2;
  char *msg;
  char *pcVar3;
  _Elt_pointer ppVar4;
  uint uVar5;
  _Elt_pointer ppVar6;
  ulong uVar7;
  rtosc_arg_t rVar8;
  _Map_pointer local_40;
  
  pUVar1 = this->impl;
  ppVar6 = (pUVar1->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar4 = (pUVar1->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_40 = (pUVar1->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar2 = (pUVar1->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uVar5 = 0;
  while (uVar7 = (ulong)uVar5, ppVar6 != ppVar2) {
    msg = ppVar6->second;
    uVar5 = uVar5 + 1;
    rVar8 = rtosc_argument(msg,0);
    pcVar3 = rtosc_argument_string(msg);
    printf("#%d type: %s dest: %s arguments: %s\n",uVar7,msg,rVar8.d,pcVar3);
    ppVar6 = ppVar6 + 1;
    if (ppVar6 == ppVar4) {
      ppVar6 = local_40[1];
      local_40 = local_40 + 1;
      ppVar4 = ppVar6 + 0x20;
    }
  }
  return;
}

Assistant:

void UndoHistory::showHistory(void) const
{
    int i = 0;
    for(auto s : impl->history)
        printf("#%d type: %s dest: %s arguments: %s\n", i++,
                s.second, rtosc_argument(s.second, 0).s, rtosc_argument_string(s.second));
}